

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

_Bool arm_s1_regime_using_lpae_format_aarch64(CPUARMState_conflict *env,ARMMMUIdx mmu_idx)

{
  _Bool _Var1;
  ARMMMUIdx mmu_idx_00;
  ARMMMUIdx mmu_idx_local;
  CPUARMState_conflict *env_local;
  
  mmu_idx_00 = stage_1_mmu_idx(mmu_idx);
  _Var1 = regime_using_lpae_format(env,mmu_idx_00);
  return _Var1;
}

Assistant:

bool arm_s1_regime_using_lpae_format(CPUARMState *env, ARMMMUIdx mmu_idx)
{
    mmu_idx = stage_1_mmu_idx(mmu_idx);

    return regime_using_lpae_format(env, mmu_idx);
}